

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

void duckdb_re2::FactorAlternationImpl::Round1
               (Regexp **sub,int nsub,ParseFlags flags,
               vector<duckdb_re2::Splice,_std::allocator<duckdb_re2::Splice>_> *splices)

{
  int iVar1;
  Regexp *__args;
  int in_ESI;
  long in_RDI;
  int j;
  Regexp *prefix;
  int same;
  ParseFlags runeflags_i;
  int nrune_i;
  Rune *rune_i;
  int i;
  ParseFlags runeflags;
  int nrune;
  Rune *rune;
  int start;
  int in_stack_0000019c;
  Regexp *in_stack_000001a0;
  ParseFlags *in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff90;
  uint uVar2;
  int in_stack_ffffffffffffff94;
  Regexp *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  ParseFlags in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int iVar3;
  int iVar4;
  Rune *local_40;
  int local_34;
  int local_30;
  int local_2c;
  Rune *local_28;
  int local_1c;
  
  local_1c = 0;
  local_28 = (Rune *)0x0;
  local_2c = 0;
  local_30 = 0;
  local_34 = 0;
  do {
    if (in_ESI < local_34) {
      return;
    }
    local_40 = (Rune *)0x0;
    iVar4 = 0;
    iVar3 = 0;
    if ((local_34 < in_ESI) &&
       (local_40 = Regexp::LeadingString
                             (in_stack_ffffffffffffff98,
                              (int *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                              in_stack_ffffffffffffff88), iVar3 == local_30)) {
      in_stack_ffffffffffffffb4 = 0;
      uVar2 = in_stack_ffffffffffffff90;
      while( true ) {
        in_stack_ffffffffffffff90 = uVar2 & 0xffffff;
        if ((in_stack_ffffffffffffffb4 < local_2c) &&
           (in_stack_ffffffffffffff90 = uVar2 & 0xffffff, in_stack_ffffffffffffffb4 < iVar4)) {
          in_stack_ffffffffffffff90 =
               CONCAT13(local_28[in_stack_ffffffffffffffb4] == local_40[in_stack_ffffffffffffffb4],
                        (int3)uVar2);
        }
        if ((char)(in_stack_ffffffffffffff90 >> 0x18) == '\0') break;
        in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 + 1;
        uVar2 = in_stack_ffffffffffffff90;
      }
      iVar1 = in_stack_ffffffffffffffb4;
      if (in_stack_ffffffffffffffb4 < 1) goto LAB_00845128;
    }
    else {
LAB_00845128:
      if ((local_34 != local_1c) && (local_34 != local_1c + 1)) {
        __args = Regexp::LiteralString
                           ((Rune *)CONCAT44(iVar4,iVar3),in_stack_ffffffffffffffb4,
                            in_stack_ffffffffffffffb0);
        for (iVar1 = local_1c; iVar1 < local_34; iVar1 = iVar1 + 1) {
          Regexp::RemoveLeadingString(in_stack_000001a0,in_stack_0000019c);
        }
        in_stack_ffffffffffffff98 = (Regexp *)(in_RDI + (long)local_1c * 8);
        in_stack_ffffffffffffff94 = local_34 - local_1c;
        std::vector<duckdb_re2::Splice,std::allocator<duckdb_re2::Splice>>::
        emplace_back<duckdb_re2::Regexp*&,duckdb_re2::Regexp**,int>
                  ((vector<duckdb_re2::Splice,_std::allocator<duckdb_re2::Splice>_> *)
                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),(Regexp **)__args,
                   (Regexp ***)CONCAT44(iVar1,in_stack_ffffffffffffffa0),
                   (int *)in_stack_ffffffffffffff98);
      }
      iVar1 = local_2c;
      if (local_34 < in_ESI) {
        local_1c = local_34;
        local_28 = local_40;
        local_30 = iVar3;
        iVar1 = iVar4;
      }
    }
    local_2c = iVar1;
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

void FactorAlternationImpl::Round1(Regexp** sub, int nsub,
                                   Regexp::ParseFlags flags,
                                   std::vector<Splice>* splices) {
  // Round 1: Factor out common literal prefixes.
  int start = 0;
  Rune* rune = NULL;
  int nrune = 0;
  Regexp::ParseFlags runeflags = Regexp::NoParseFlags;
  for (int i = 0; i <= nsub; i++) {
    // Invariant: sub[start:i] consists of regexps that all
    // begin with rune[0:nrune].
    Rune* rune_i = NULL;
    int nrune_i = 0;
    Regexp::ParseFlags runeflags_i = Regexp::NoParseFlags;
    if (i < nsub) {
      rune_i = Regexp::LeadingString(sub[i], &nrune_i, &runeflags_i);
      if (runeflags_i == runeflags) {
        int same = 0;
        while (same < nrune && same < nrune_i && rune[same] == rune_i[same])
          same++;
        if (same > 0) {
          // Matches at least one rune in current range.  Keep going around.
          nrune = same;
          continue;
        }
      }
    }

    // Found end of a run with common leading literal string:
    // sub[start:i] all begin with rune[0:nrune],
    // but sub[i] does not even begin with rune[0].
    if (i == start) {
      // Nothing to do - first iteration.
    } else if (i == start+1) {
      // Just one: don't bother factoring.
    } else {
      Regexp* prefix = Regexp::LiteralString(rune, nrune, runeflags);
      for (int j = start; j < i; j++)
        Regexp::RemoveLeadingString(sub[j], nrune);
      splices->emplace_back(prefix, sub + start, i - start);
    }

    // Prepare for next iteration (if there is one).
    if (i < nsub) {
      start = i;
      rune = rune_i;
      nrune = nrune_i;
      runeflags = runeflags_i;
    }
  }
}